

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O0

void __thiscall
duckdb::RleBpDecoder::RleBpDecoder
          (RleBpDecoder *this,data_ptr_t buffer,uint32_t buffer_len,uint32_t bit_width)

{
  runtime_error *this_00;
  uint in_ECX;
  uint in_EDX;
  data_ptr_t in_RSI;
  ByteBuffer *in_RDI;
  
  ByteBuffer::ByteBuffer(in_RDI,in_RSI,(ulong)in_EDX);
  *(uint *)&in_RDI[1].ptr = in_ECX;
  in_RDI[1].len = 0;
  *(undefined4 *)&in_RDI[2].ptr = 0;
  *(undefined4 *)((long)&in_RDI[2].ptr + 4) = 0;
  *(undefined1 *)&in_RDI[3].len = 0;
  if (0x3f < in_ECX) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Decode bit width too large");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(char *)&in_RDI[2].len = (char)(*(int *)&in_RDI[1].ptr + 7U >> 3);
  in_RDI[3].ptr = (data_ptr_t)((1L << ((byte)*(undefined4 *)&in_RDI[1].ptr & 0x3f)) + -1);
  return;
}

Assistant:

RleBpDecoder(data_ptr_t buffer, uint32_t buffer_len, uint32_t bit_width)
	    : buffer_(buffer, buffer_len), bit_width_(bit_width), current_value_(0), repeat_count_(0), literal_count_(0) {
		if (bit_width >= 64) {
			throw std::runtime_error("Decode bit width too large");
		}
		byte_encoded_len = ((bit_width_ + 7) / 8);
		max_val = (uint64_t(1) << bit_width_) - 1;
	}